

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint32_t helper_float_floor_w_d_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\x01';
  uVar3 = float64_to_int32_mips64(fdt0,&(env->active_fpu).fp_status);
  uVar2 = (env->active_fpu).fcr31;
  (env->active_fpu).fp_status.float_rounding_mode = (char)ieee_rm_mips64[uVar2 & 3];
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar6 = uVar5 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar6;
  if (uVar5 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar2 >> 7 & uVar5) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar6 | uVar5 << 2;
  }
  uVar4 = 0x7fffffff;
  if ((bVar1 & 9) == 0) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

uint32_t helper_float_floor_w_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;

    set_float_rounding_mode(float_round_down, &env->active_fpu.fp_status);
    wt2 = float64_to_int32(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return wt2;
}